

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void av1_nn_propagate_4to1_sse3(float *inputs,float *weights,__m128 *output)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fStack_88;
  float fStack_84;
  __m128 hadd2;
  __m128 hadd1;
  __m128 mul;
  __m128 weights128;
  __m128 inputs128;
  __m128 *output_local;
  float *weights_local;
  float *inputs_local;
  float fStack_10;
  float fStack_c;
  
  hadd2[2] = (float)*(undefined8 *)inputs;
  hadd2[3] = (float)((ulong)*(undefined8 *)inputs >> 0x20);
  hadd1[0] = (float)*(undefined8 *)(inputs + 2);
  hadd1[1] = (float)((ulong)*(undefined8 *)(inputs + 2) >> 0x20);
  fStack_88 = (float)*(undefined8 *)weights;
  fStack_84 = (float)((ulong)*(undefined8 *)weights >> 0x20);
  hadd2[0] = (float)*(undefined8 *)(weights + 2);
  hadd2[1] = (float)((ulong)*(undefined8 *)(weights + 2) >> 0x20);
  fVar1 = hadd2[2] * fStack_88 + hadd2[3] * fStack_84;
  fVar2 = hadd1[0] * hadd2[0] + hadd1[1] * hadd2[1];
  fVar3 = hadd2[2] * fStack_88 + hadd2[3] * fStack_84;
  fVar4 = hadd1[0] * hadd2[0] + hadd1[1] * hadd2[1];
  inputs_local._0_4_ = (float)*(undefined8 *)*output;
  inputs_local._4_4_ = (float)((ulong)*(undefined8 *)*output >> 0x20);
  fStack_10 = (float)*(undefined8 *)(*output + 2);
  fStack_c = (float)((ulong)*(undefined8 *)(*output + 2) >> 0x20);
  (*output)[0] = inputs_local._0_4_ + fVar1 + fVar2;
  (*output)[1] = inputs_local._4_4_ + fVar3 + fVar4;
  (*output)[2] = fStack_10 + fVar1 + fVar2;
  (*output)[3] = fStack_c + fVar3 + fVar4;
  return;
}

Assistant:

void av1_nn_propagate_4to1_sse3(const float *const inputs,
                                const float *const weights,
                                __m128 *const output) {
  const __m128 inputs128 = _mm_loadu_ps(inputs);

  const __m128 weights128 = _mm_loadu_ps(weights);

  const __m128 mul = _mm_mul_ps(inputs128, weights128);
  // [3 2 1 0] (weight and input indices)

  const __m128 hadd1 = _mm_hadd_ps(mul, mul);
  // [3+2 1+0 3+2 1+0]
  const __m128 hadd2 = _mm_hadd_ps(hadd1, hadd1);
  // [3+2+1+0 3+2+1+0 3+2+1+0 3+2+1+0]
  *output = _mm_add_ps(*output, hadd2);
}